

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
Matrix::RandomNumbersInMatrix
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,Matrix *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *matrixVec)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_00;
  int iVar1;
  time_t tVar2;
  reference this_01;
  int local_58;
  int j;
  vector<int,_std::allocator<int>_> local_48;
  int local_2c;
  undefined4 local_28;
  int i;
  int numberOfFigures;
  int randomNumber;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *matrixVec_local;
  Matrix *this_local;
  
  _numberOfFigures = matrixVec;
  matrixVec_local = &this->_matrixVec;
  this_local = (Matrix *)__return_storage_ptr__;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  local_28 = 5;
  for (local_2c = 0; this_00 = _numberOfFigures, local_2c < 3; local_2c = local_2c + 1) {
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_48);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(this_00,&local_48);
    std::vector<int,_std::allocator<int>_>::~vector(&local_48);
    for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
      iVar1 = rand();
      i = iVar1 % 5 + 1;
      this_01 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](_numberOfFigures,(long)local_2c);
      std::vector<int,_std::allocator<int>_>::push_back(this_01,&i);
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,_numberOfFigures);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<int>> Matrix::RandomNumbersInMatrix(std::vector<std::vector<int>>& matrixVec) {
	srand(time(0));
	int randomNumber;
	int const numberOfFigures = 5;
	for (int i = 0; i < _rows; ++i) {
		matrixVec.push_back(std::vector<int>());

		for (int j = 0; j < _columns; ++j) {
			randomNumber = rand() % numberOfFigures + 1;
			matrixVec[i].push_back(randomNumber);
		}
	}

	return matrixVec;
}